

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O3

size_t bitsToChunks(size_t chunkLenBits,uint8_t *input,size_t inputLen,uint16_t *chunks)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  size_t j;
  size_t sVar6;
  int iVar7;
  
  if ((chunkLenBits != 0) && (chunkLenBits <= inputLen << 3)) {
    uVar2 = (inputLen << 3) / chunkLenBits;
    lVar4 = 0;
    uVar3 = 0;
    do {
      chunks[uVar3] = 0;
      sVar6 = 0;
      iVar7 = 0;
      do {
        uVar1 = lVar4 + sVar6;
        uVar5 = (uint)sVar6;
        sVar6 = sVar6 + 1;
        iVar7 = iVar7 + ((input[uVar1 >> 3] >> (~(byte)uVar1 & 7) & 1) << (uVar5 & 0x1f));
        chunks[uVar3] = (uint16_t)iVar7;
      } while (chunkLenBits != sVar6);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + chunkLenBits;
    } while (uVar3 < uVar2);
    return uVar2;
  }
  return 0;
}

Assistant:

static size_t bitsToChunks(size_t chunkLenBits, const uint8_t* input, size_t inputLen,
                           uint16_t* chunks) {
  if (!chunkLenBits || chunkLenBits > inputLen * 8) {
    assert(!"Invalid input to bitsToChunks: not enough input");
    return 0;
  }
  size_t chunkCount = ((inputLen * 8) / chunkLenBits);

  for (size_t i = 0; i < chunkCount; i++) {
    chunks[i] = 0;
    for (size_t j = 0; j < chunkLenBits; j++) {
      chunks[i] += getBit(input, i * chunkLenBits + j) << j;
      assert(chunks[i] < (1 << chunkLenBits));
    }
  }

  return chunkCount;
}